

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indent.h
# Opt level: O2

string * __thiscall re2c::indent_abi_cxx11_(string *__return_storage_ptr__,re2c *this,uint32_t ind)

{
  opt_t *poVar1;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = (int)this + 1;
  while( true ) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar1->target == DOT) || (iVar2 = iVar2 + -1, iVar2 == 0)) break;
    realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string indent (uint32_t ind)
{
	std::string str;

	while (opts->target != opt_t::DOT && ind-- > 0)
	{
		str += opts->indString;
	}
	return str;
}